

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O1

string * gl4cts::DirectStateAccess::VertexArrays::Utilities::replace
                   (string *__return_storage_ptr__,string *src,string *key,string *value)

{
  pointer pcVar1;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (src->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + src->_M_string_length);
  for (uVar2 = std::__cxx11::string::find
                         ((char *)__return_storage_ptr__,(ulong)(key->_M_dataplus)._M_p,0);
      uVar2 != 0xffffffffffffffff;
      uVar2 = std::__cxx11::string::find
                        ((char *)__return_storage_ptr__,(ulong)(key->_M_dataplus)._M_p,
                         uVar2 + key->_M_string_length)) {
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,uVar2,(char *)key->_M_string_length,
               (ulong)(value->_M_dataplus)._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Utilities::replace(const std::string& src, const std::string& key, const std::string& value)
{
	size_t		pos = 0;
	std::string dst = src;

	while (std::string::npos != (pos = dst.find(key, pos)))
	{
		dst.replace(pos, key.length(), value);
		pos += key.length();
	}

	return dst;
}